

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

void approx(double *x,double *y,int N,double *xout,double *yout,int Nout)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  
  if (0 < Nout) {
    iVar4 = N + -1;
    uVar6 = 0;
    do {
      dVar1 = xout[uVar6];
      dVar10 = dVar1;
      if (!NAN(dVar1)) {
        if (*x <= dVar1) {
          if (dVar1 < x[iVar4] || dVar1 == x[iVar4]) {
            iVar5 = iVar4;
            if (N < 3) {
              lVar8 = 0;
            }
            else {
              iVar7 = 0;
              do {
                iVar9 = (iVar5 + iVar7) / 2;
                if (x[iVar9] <= dVar1) {
                  iVar7 = iVar9;
                  iVar9 = iVar5;
                }
                iVar5 = iVar9;
              } while (iVar7 < iVar5 + -1);
              lVar8 = (long)iVar7;
            }
            dVar2 = x[iVar5];
            if ((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) {
              dVar3 = x[lVar8];
              dVar10 = y[lVar8];
              if ((dVar3 != dVar1) || (NAN(dVar3) || NAN(dVar1))) {
                dVar10 = ((dVar1 - dVar3) / (dVar2 - dVar3)) * (y[iVar5] - dVar10) + dVar10;
              }
            }
            else {
              dVar10 = y[iVar5];
            }
          }
          else {
            dVar10 = y[iVar4];
          }
        }
        else {
          dVar10 = *y;
        }
      }
      yout[uVar6] = dVar10;
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)Nout);
  }
  return;
}

Assistant:

void approx(double *x,double *y, int N,double *xout, double *yout,int Nout) {
    int i;
	/* x and y should be sorted in ascending order. x has all unique values
		xout contains equally spaced Nout values from lowest x[0]
		to highest x[N-1].Outputs y[out] are Nout interpolated values.
	*/

    for(i = 0; i < Nout;++i) {
        if (xout[i] == xout[i]) {
            yout[i] = interpolate_linear_sorted_ascending(x,y,N,xout[i]);
        } else {
            yout[i] = xout[i];
        }
    }

}